

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLModels.cpp
# Opt level: O2

void XPMP2::CSLModelsAdd(CSLModel *_csl)

{
  uint uVar1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>
  _Var2;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>,_bool>
  pVar4;
  string local_58;
  string cslKey;
  
  CSLModel::GetKeyString_abi_cxx11_(&cslKey,_csl);
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XPMP2::CSLModel>,std::_Select1st<std::pair<std::__cxx11::string_const,XPMP2::CSLModel>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XPMP2::CSLModel>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,XPMP2::CSLModel>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XPMP2::CSLModel>,std::_Select1st<std::pair<std::__cxx11::string_const,XPMP2::CSLModel>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XPMP2::CSLModel>>>
                      *)&DAT_002cc608,&cslKey,_csl);
  _Var2 = pVar4.first._M_node;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (glob < 3) {
      p_Var3 = _Var2._M_node[4]._M_parent;
      uVar1 = *(uint *)&_Var2._M_node[8]._M_parent;
      StripXPSysDir(&local_58,(string *)&_Var2._M_node[7]._M_parent);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLModels.cpp"
             ,0x26d,"CSLModelsAdd",logWARN,
             "Duplicate model \'%s\', additional definitions ignored, originally defined in line %d of %s"
             ,p_Var3,(ulong)uVar1,local_58._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  else {
    p_Var3 = (_Base_ptr)&_Var2._M_node[6]._M_parent;
    while (p_Var3 = *(_Base_ptr *)p_Var3, p_Var3 != (_Base_ptr)&_Var2._M_node[6]._M_parent) {
      std::__cxx11::string::_M_assign((string *)&p_Var3->_M_left);
    }
  }
  std::__cxx11::string::~string((string *)&cslKey);
  return;
}

Assistant:

void CSLModelsAdd (CSLModel& _csl)
{
    // the main map, which actually "owns" the object, indexed by key
    const std::string cslKey = _csl.GetKeyString();
    auto p = glob.mapCSLModels.emplace(cslKey, std::move(_csl));
    if (!p.second) {                    // not inserted, ie. not a new entry!
        LOG_MSG(logWARN, WARN_DUP_MODEL, p.first->second.GetModelName().c_str(),
                p.first->second.xsbAircraftLn,
                StripXPSysDir(p.first->second.xsbAircraftPath).c_str());
    } else {
        // Need to update the cslKey that is stored in the CSL objects as only now we have the final value
        for (CSLObj& obj : p.first->second.listObj)
            obj.cslKey = cslKey;
    }
}